

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameResolveTrigger(Parse *pParse)

{
  sqlite3 *db;
  Trigger *pTVar1;
  Db *pDVar2;
  char *zName;
  TriggerStep *pStep;
  anon_union_8_4_82a96254_for_uNC aVar3;
  int iVar4;
  uint uVar5;
  Table *pTable;
  SrcList *pSrc;
  Select *pSVar6;
  SrcList *pSVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  TriggerStep **ppTVar11;
  NameContext local_68;
  
  db = pParse->db;
  pTVar1 = pParse->pNewTrigger;
  local_68._40_8_ = 0;
  local_68.pWinSelect = (Select *)0x0;
  local_68.pNext = (NameContext *)0x0;
  local_68.nRef = 0;
  local_68.nNcErr = 0;
  local_68.pSrcList = (SrcList *)0x0;
  local_68.uNC.pEList = (ExprList *)0x0;
  pDVar2 = db->aDb;
  zName = pTVar1->table;
  local_68.pParse = pParse;
  iVar4 = sqlite3SchemaToIndex(db,pTVar1->pTabSchema);
  pTable = sqlite3FindTable(db,zName,pDVar2[iVar4].zDbSName);
  pParse->pTriggerTab = pTable;
  pParse->eTriggerOp = pTVar1->op;
  if ((pTable == (Table *)0x0) || (uVar5 = sqlite3ViewGetColumnNames(pParse,pTable), uVar5 == 0)) {
    if (pTVar1->pWhen == (Expr *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = sqlite3ResolveExprNames(&local_68,pTVar1->pWhen);
    }
  }
  ppTVar11 = &pTVar1->step_list;
  do {
    if ((uVar5 != 0) || (pStep = *ppTVar11, pStep == (TriggerStep *)0x0)) {
      return uVar5;
    }
    if (((pStep->pSelect == (Select *)0x0) ||
        (sqlite3SelectPrep(pParse,pStep->pSelect,&local_68), pParse->nErr == 0)) ||
       (uVar5 = pParse->rc, uVar5 == 0)) {
      if (pStep->zTarget == (char *)0x0) {
        uVar5 = 0;
      }
      else {
        pSrc = sqlite3TriggerStepSrc(pParse,pStep);
        uVar5 = 7;
        if (pSrc != (SrcList *)0x0) {
          pSVar6 = sqlite3SelectNew(pParse,pStep->pExprList,pSrc,(Expr *)0x0,(ExprList *)0x0,
                                    (Expr *)0x0,(ExprList *)0x0,0,(Expr *)0x0);
          if (pSVar6 == (Select *)0x0) {
            pStep->pExprList = (ExprList *)0x0;
            pSrc = (SrcList *)0x0;
            uVar5 = 7;
          }
          else {
            sqlite3SelectPrep(pParse,pSVar6,(NameContext *)0x0);
            iVar4 = pParse->nErr;
            if (pStep->pExprList != (ExprList *)0x0) {
              pSVar6->pEList = (ExprList *)0x0;
            }
            uVar8 = (uint)(iVar4 != 0);
            pSVar6->pSrc = (SrcList *)0x0;
            sqlite3SelectDelete(db,pSVar6);
            pSVar7 = pStep->pFrom;
            uVar5 = 1;
            if (pSVar7 == (SrcList *)0x0) {
              uVar5 = uVar8;
            }
            if (pSVar7 != (SrcList *)0x0 && iVar4 == 0) {
              lVar9 = 0x30;
              for (lVar10 = 0; uVar5 = uVar8, lVar10 < pSVar7->nSrc; lVar10 = lVar10 + 1) {
                pSVar6 = *(Select **)((long)pSVar7->a + lVar9 + -8);
                if (pSVar6 != (Select *)0x0) {
                  sqlite3SelectPrep(pParse,pSVar6,(NameContext *)0x0);
                  pSVar7 = pStep->pFrom;
                }
                lVar9 = lVar9 + 0x68;
              }
            }
          }
          if (db->mallocFailed != '\0') {
            uVar5 = 7;
          }
          local_68.pSrcList = pSrc;
          if (uVar5 == 0) {
            if (pStep->pWhere != (Expr *)0x0) {
              iVar4 = sqlite3ResolveExprNames(&local_68,pStep->pWhere);
              uVar5 = 1;
              if (iVar4 != 0) goto LAB_001bbcc5;
            }
            uVar5 = sqlite3ResolveExprListNames(&local_68,pStep->pExprList);
          }
LAB_001bbcc5:
          aVar3 = (anon_union_8_4_82a96254_for_uNC)pStep->pUpsert;
          if (uVar5 == 0 && (Upsert *)aVar3.pEList != (Upsert *)0x0) {
            (aVar3.pUpsert)->pUpsertSrc = pSrc;
            local_68.ncFlags = 0x200;
            local_68.uNC = aVar3;
            uVar5 = sqlite3ResolveExprListNames(&local_68,(aVar3.pUpsert)->pUpsertTarget);
            if ((uVar5 == 0) &&
               (uVar5 = sqlite3ResolveExprListNames(&local_68,(aVar3.pUpsert)->pUpsertSet),
               uVar5 == 0)) {
              iVar4 = sqlite3ResolveExprNames(&local_68,*(Expr **)&(aVar3.pEList)->a[0].fg);
              uVar5 = 1;
              if (iVar4 == 0) {
                uVar5 = sqlite3ResolveExprNames(&local_68,(aVar3.pEList)->a[0].pExpr);
              }
            }
            local_68._40_8_ = local_68._40_8_ & 0xffffffff00000000;
          }
          local_68.pSrcList = (SrcList *)0x0;
          sqlite3SrcListDelete(db,pSrc);
        }
      }
    }
    ppTVar11 = &pStep->pNext;
  } while( true );
}

Assistant:

static int renameResolveTrigger(Parse *pParse){
  sqlite3 *db = pParse->db;
  Trigger *pNew = pParse->pNewTrigger;
  TriggerStep *pStep;
  NameContext sNC;
  int rc = SQLITE_OK;

  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  assert( pNew->pTabSchema );
  pParse->pTriggerTab = sqlite3FindTable(db, pNew->table,
      db->aDb[sqlite3SchemaToIndex(db, pNew->pTabSchema)].zDbSName
  );
  pParse->eTriggerOp = pNew->op;
  /* ALWAYS() because if the table of the trigger does not exist, the
  ** error would have been hit before this point */
  if( ALWAYS(pParse->pTriggerTab) ){
    rc = sqlite3ViewGetColumnNames(pParse, pParse->pTriggerTab);
  }

  /* Resolve symbols in WHEN clause */
  if( rc==SQLITE_OK && pNew->pWhen ){
    rc = sqlite3ResolveExprNames(&sNC, pNew->pWhen);
  }

  for(pStep=pNew->step_list; rc==SQLITE_OK && pStep; pStep=pStep->pNext){
    if( pStep->pSelect ){
      sqlite3SelectPrep(pParse, pStep->pSelect, &sNC);
      if( pParse->nErr ) rc = pParse->rc;
    }
    if( rc==SQLITE_OK && pStep->zTarget ){
      SrcList *pSrc = sqlite3TriggerStepSrc(pParse, pStep);
      if( pSrc ){
        Select *pSel = sqlite3SelectNew(
            pParse, pStep->pExprList, pSrc, 0, 0, 0, 0, 0, 0
        );
        if( pSel==0 ){
          pStep->pExprList = 0;
          pSrc = 0;
          rc = SQLITE_NOMEM;
        }else{
          sqlite3SelectPrep(pParse, pSel, 0);
          rc = pParse->nErr ? SQLITE_ERROR : SQLITE_OK;
          assert( pStep->pExprList==0 || pStep->pExprList==pSel->pEList );
          assert( pSrc==pSel->pSrc );
          if( pStep->pExprList ) pSel->pEList = 0;
          pSel->pSrc = 0;
          sqlite3SelectDelete(db, pSel);
        }
        if( pStep->pFrom ){
          int i;
          for(i=0; i<pStep->pFrom->nSrc && rc==SQLITE_OK; i++){
            SrcItem *p = &pStep->pFrom->a[i];
            if( p->pSelect ){
              sqlite3SelectPrep(pParse, p->pSelect, 0);
            }
          }
        }

        if(  db->mallocFailed ){
          rc = SQLITE_NOMEM;
        }
        sNC.pSrcList = pSrc;
        if( rc==SQLITE_OK && pStep->pWhere ){
          rc = sqlite3ResolveExprNames(&sNC, pStep->pWhere);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3ResolveExprListNames(&sNC, pStep->pExprList);
        }
        assert( !pStep->pUpsert || (!pStep->pWhere && !pStep->pExprList) );
        if( pStep->pUpsert && rc==SQLITE_OK ){
          Upsert *pUpsert = pStep->pUpsert;
          pUpsert->pUpsertSrc = pSrc;
          sNC.uNC.pUpsert = pUpsert;
          sNC.ncFlags = NC_UUpsert;
          rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
          if( rc==SQLITE_OK ){
            ExprList *pUpsertSet = pUpsert->pUpsertSet;
            rc = sqlite3ResolveExprListNames(&sNC, pUpsertSet);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertWhere);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
          }
          sNC.ncFlags = 0;
        }
        sNC.pSrcList = 0;
        sqlite3SrcListDelete(db, pSrc);
      }else{
        rc = SQLITE_NOMEM;
      }
    }
  }
  return rc;
}